

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O1

void RecyclerTestObject::EndWalk(void)

{
  uint uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  uint extraout_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  ulong uVar4;
  
  if (currentWalkDepth == 0) {
    PAL_wprintf(L"Full heap walk finished\n");
    PAL_wprintf(L"Object Count:           %12llu\n",walkObjectCount);
    PAL_wprintf(L"Scanned Bytes:          %12llu\n",walkScannedByteCount);
    PAL_wprintf(L"Barrier Bytes:          %12llu\n",walkBarrierByteCount);
    PAL_wprintf(L"Tracked Bytes:          %12llu\n",walkTrackedByteCount);
    PAL_wprintf(L"Finalized Bytes:        %12llu\n",walkFinalizedByteCount);
    PAL_wprintf(L"RecyclerVisited Bytes:  %12llu\n",walkRecyclerVisitedByteCount);
    PAL_wprintf(L"Leaf Bytes:             %12llu\n",walkLeafByteCount);
    PAL_wprintf(L"Total Bytes:            %12llu\n",
                walkBarrierByteCount + walkScannedByteCount + walkTrackedByteCount +
                walkFinalizedByteCount + walkLeafByteCount + walkRecyclerVisitedByteCount);
    PAL_wprintf(L"Max Depth:              %12llu\n",maxWalkDepth);
    return;
  }
  EndWalk();
  uVar4 = (ulong)extraout_EDX;
  pvVar2 = realloc((void *)*in_RDI,(uVar4 + *(uint *)(in_RDI + 1)) * 8);
  if (pvVar2 != (void *)0x0) {
    *in_RDI = (long)pvVar2;
    if (extraout_EDX != 0) {
      uVar1 = *(uint *)(in_RDI + 1);
      do {
        *(undefined8 *)(*in_RDI + (ulong)uVar1 * 8) = in_RSI;
        uVar1 = uVar1 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    *(uint *)(in_RDI + 1) = (int)in_RDI[1] + extraout_EDX;
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "OOM in AddWeightedEntry realloc";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

static void EndWalk()
    {
        VerifyCondition(currentWalkDepth == 0);

        wprintf(_u("Full heap walk finished\n"));
        wprintf(_u("Object Count:           %12llu\n"), (unsigned long long) walkObjectCount);
        wprintf(_u("Scanned Bytes:          %12llu\n"), (unsigned long long) walkScannedByteCount);
        wprintf(_u("Barrier Bytes:          %12llu\n"), (unsigned long long) walkBarrierByteCount);
        wprintf(_u("Tracked Bytes:          %12llu\n"), (unsigned long long) walkTrackedByteCount);
        wprintf(_u("Finalized Bytes:        %12llu\n"), (unsigned long long) walkFinalizedByteCount);
        wprintf(_u("RecyclerVisited Bytes:  %12llu\n"), (unsigned long long) walkRecyclerVisitedByteCount);
        wprintf(_u("Leaf Bytes:             %12llu\n"), (unsigned long long) walkLeafByteCount);
        wprintf(_u("Total Bytes:            %12llu\n"), (unsigned long long) (walkScannedByteCount + walkBarrierByteCount + walkTrackedByteCount + walkFinalizedByteCount + walkLeafByteCount + walkRecyclerVisitedByteCount));
        wprintf(_u("Max Depth:              %12llu\n"), (unsigned long long) maxWalkDepth);
    }